

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

bool __thiscall
soplex::SoPlexBase<double>::getPrimal(SoPlexBase<double> *this,VectorBase<double> *vector)

{
  bool bVar1;
  
  if (((this->_hasSolReal == false) && ((this->_hasSolRational & 1U) == 0)) ||
     ((int)((ulong)((long)(vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3) <
      (this->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum)) {
    bVar1 = false;
  }
  else {
    _syncRealSolution(this);
    SolBase<double>::getPrimalSol(&this->_solReal,vector);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool SoPlexBase<R>::getPrimal(VectorBase<R>& vector)
{
   if(hasSol() && vector.dim() >= numCols())
   {
      _syncRealSolution();
      _solReal.getPrimalSol(vector);
      return true;
   }
   else
      return false;
}